

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_tran_test.c
# Opt level: O0

void test_udp_multi_send_recv(void)

{
  nng_err nVar1;
  int iVar2;
  char *pcVar3;
  nng_err result__16;
  nng_err result__15;
  nng_err result__14;
  int i;
  int rv;
  nng_err result__13;
  nng_err result__12;
  nng_err result__11;
  nng_err result__10;
  nng_err result__9;
  nng_err result__8;
  nng_err result__7;
  nng_err result__6;
  nng_err result__5;
  nng_err result__4;
  nng_err result__3;
  nng_err result__2;
  nng_err result__1;
  nng_err result_;
  char *addr;
  size_t sz;
  nng_dialer d;
  nng_listener l;
  nng_socket s1;
  nng_socket s0;
  char buf [256];
  char msg [256];
  
  nuts_scratch_addr("udp",0x40,test_udp_multi_send_recv::nuts_addr_);
  nVar1 = nng_pair1_open((nng_socket *)&l);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/udp/udp_tran_test.c"
                         ,0xd0,"%s: expected success, got %s (%d)","nng_pair1_open(&(s0))",pcVar3,
                         nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_socket_set_ms((nng_socket)l.id,"recv-timeout",100);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/udp/udp_tran_test.c"
                         ,0xd1,"%s: expected success, got %s (%d)",
                         "nng_socket_set_ms(s0, NNG_OPT_RECVTIMEO, 100)",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_socket_set_ms((nng_socket)l.id,"send-timeout",100);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/udp/udp_tran_test.c"
                         ,0xd2,"%s: expected success, got %s (%d)",
                         "nng_socket_set_ms(s0, NNG_OPT_SENDTIMEO, 100)",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_listener_create((nng_listener *)((long)&sz + 4),(nng_socket)l.id,
                              test_udp_multi_send_recv::nuts_addr_);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/udp/udp_tran_test.c"
                         ,0xd3,"%s: expected success, got %s (%d)",
                         "nng_listener_create(&l, s0, addr)",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_listener_set_size(sz._4_4_,"udp:copy-max",100);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/udp/udp_tran_test.c"
                         ,0xd4,"%s: expected success, got %s (%d)",
                         "nng_listener_set_size(l, NNG_OPT_UDP_COPY_MAX, 100)",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_listener_get_size(sz._4_4_,"udp:copy-max",(size_t *)&addr);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/udp/udp_tran_test.c"
                         ,0xd5,"%s: expected success, got %s (%d)",
                         "nng_listener_get_size(l, NNG_OPT_UDP_COPY_MAX, &sz)",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  acutest_check_((uint)(addr == (char *)0x64),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/udp/udp_tran_test.c"
                 ,0xd6,"%s","sz == 100");
  nVar1 = nng_listener_start(sz._4_4_,0);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/udp/udp_tran_test.c"
                         ,0xd7,"%s: expected success, got %s (%d)","nng_listener_start(l, 0)",pcVar3
                         ,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_pair1_open((nng_socket *)&d);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/udp/udp_tran_test.c"
                         ,0xd9,"%s: expected success, got %s (%d)","nng_pair1_open(&(s1))",pcVar3,
                         nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_socket_set_ms((nng_socket)d.id,"recv-timeout",100);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/udp/udp_tran_test.c"
                         ,0xda,"%s: expected success, got %s (%d)",
                         "nng_socket_set_ms(s1, NNG_OPT_RECVTIMEO, 100)",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_socket_set_ms((nng_socket)d.id,"send-timeout",100);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/udp/udp_tran_test.c"
                         ,0xdb,"%s: expected success, got %s (%d)",
                         "nng_socket_set_ms(s1, NNG_OPT_SENDTIMEO, 100)",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_dialer_create((nng_dialer *)&sz,(nng_socket)d.id,test_udp_multi_send_recv::nuts_addr_)
  ;
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/udp/udp_tran_test.c"
                         ,0xdc,"%s: expected success, got %s (%d)","nng_dialer_create(&d, s1, addr)"
                         ,pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_dialer_set_size(sz._0_4_,"udp:copy-max",100);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/udp/udp_tran_test.c"
                         ,0xdd,"%s: expected success, got %s (%d)",
                         "nng_dialer_set_size(d, NNG_OPT_UDP_COPY_MAX, 100)",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_dialer_get_size(sz._0_4_,"udp:copy-max",(size_t *)&addr);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/udp/udp_tran_test.c"
                         ,0xde,"%s: expected success, got %s (%d)",
                         "nng_dialer_get_size(d, NNG_OPT_UDP_COPY_MAX, &sz)",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_dialer_start(sz._0_4_,0);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/udp/udp_tran_test.c"
                         ,0xdf,"%s: expected success, got %s (%d)","nng_dialer_start(d, 0)",pcVar3,
                         nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nng_msleep(100);
  result__15 = NNG_OK;
  while (((((int)result__15 < 1000 &&
           (result__14 = nng_send((nng_socket)d.id,buf + 0xf8,0x5f,0), result__14 == NNG_OK)) &&
          (result__14 = nng_recv((nng_socket)l.id,&s1,(size_t *)&addr,0), result__14 == NNG_OK)) &&
         (((addr == (char *)0x5f &&
           (result__14 = nng_send((nng_socket)l.id,buf + 0xf8,0x5f,0), result__14 == NNG_OK)) &&
          ((result__14 = nng_recv((nng_socket)d.id,&s1,(size_t *)&addr,0), result__14 == NNG_OK &&
           (addr == (char *)0x5f))))))) {
    result__15 = result__15 + NNG_EINTR;
  }
  pcVar3 = nng_strerror(result__14);
  iVar2 = acutest_check_((uint)(result__14 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/udp/udp_tran_test.c"
                         ,0xf9,"%s: expected success, got %s (%d)","rv",pcVar3,result__14);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  acutest_check_((uint)(result__15 == NNG_EINTERNAL),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/udp/udp_tran_test.c"
                 ,0xfa,"%s","i == 1000");
  acutest_check_((uint)(addr == (char *)0x5f),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/udp/udp_tran_test.c"
                 ,0xfb,"%s","sz == 95");
  nVar1 = nng_socket_close((nng_socket)l.id);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/udp/udp_tran_test.c"
                         ,0xfc,"%s: expected success, got %s (%d)","nng_socket_close(s0)",pcVar3,
                         nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_socket_close((nng_socket)d.id);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/udp/udp_tran_test.c"
                         ,0xfd,"%s: expected success, got %s (%d)","nng_socket_close(s1)",pcVar3,
                         nVar1);
  if (iVar2 != 0) {
    return;
  }
  acutest_abort_();
}

Assistant:

void
test_udp_multi_send_recv(void)
{
	char         msg[256];
	char         buf[256];
	nng_socket   s0;
	nng_socket   s1;
	nng_listener l;
	nng_dialer   d;
	size_t       sz;
	char        *addr;

	NUTS_ADDR(addr, "udp");

	NUTS_OPEN(s0);
	NUTS_PASS(nng_socket_set_ms(s0, NNG_OPT_RECVTIMEO, 100));
	NUTS_PASS(nng_socket_set_ms(s0, NNG_OPT_SENDTIMEO, 100));
	NUTS_PASS(nng_listener_create(&l, s0, addr));
	NUTS_PASS(nng_listener_set_size(l, NNG_OPT_UDP_COPY_MAX, 100));
	NUTS_PASS(nng_listener_get_size(l, NNG_OPT_UDP_COPY_MAX, &sz));
	NUTS_TRUE(sz == 100);
	NUTS_PASS(nng_listener_start(l, 0));

	NUTS_OPEN(s1);
	NUTS_PASS(nng_socket_set_ms(s1, NNG_OPT_RECVTIMEO, 100));
	NUTS_PASS(nng_socket_set_ms(s1, NNG_OPT_SENDTIMEO, 100));
	NUTS_PASS(nng_dialer_create(&d, s1, addr));
	NUTS_PASS(nng_dialer_set_size(d, NNG_OPT_UDP_COPY_MAX, 100));
	NUTS_PASS(nng_dialer_get_size(d, NNG_OPT_UDP_COPY_MAX, &sz));
	NUTS_PASS(nng_dialer_start(d, 0));
	nng_msleep(100);

	int rv;
	int i;
	for (i = 0; i < 1000; i++) {
		if ((rv = nng_send(s1, msg, 95, 0)) != 0) {
			;
			break;
		}
		if ((rv = nng_recv(s0, buf, &sz, 0)) != 0) {
			break;
		}
		if (sz != 95) {
			break;
		}
		if ((rv = nng_send(s0, msg, 95, 0)) != 0) {
			break;
		}
		if ((rv = nng_recv(s1, buf, &sz, 0)) != 0) {
			break;
		}
		if (sz != 95) {
			break;
		}
	}
	NUTS_PASS(rv);
	NUTS_TRUE(i == 1000);
	NUTS_TRUE(sz == 95);
	NUTS_CLOSE(s0);
	NUTS_CLOSE(s1);
}